

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_initCStream_usingDict
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,int compressionLevel)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  if (compressionLevel == 0) {
    iVar1 = 3;
  }
  else {
    iVar3 = -0x20000;
    if (-0x20000 < compressionLevel) {
      iVar3 = compressionLevel;
    }
    iVar1 = 0x16;
    if (iVar3 < 0x16) {
      iVar1 = iVar3;
    }
  }
  (zcs->requestedParams).compressionLevel = iVar1;
  sVar2 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
  if (sVar2 < 0xffffffffffffff89) {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                        "Reset parameters is only possible during init stage.");
        ZSTD_clearAllDicts(cctx);
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}